

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

void __thiscall
gl4cts::EnhancedLayouts::UniformBlockMemberAlignNonPowerOf2Test::testInit
          (UniformBlockMemberAlignNonPowerOf2Test *this)

{
  int iVar1;
  UniformBlockMemberAlignNonPowerOf2Test *this_00;
  GLuint align;
  uint uVar2;
  GLuint stage;
  long lVar3;
  GLuint stage_1;
  bool bVar4;
  Type TVar5;
  bool stage_support [6];
  char acStack_56 [6];
  ulong local_50;
  value_type local_48;
  
  this_00 = this;
  for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
    this_00 = this;
    iVar1 = (*(this->super_NegativeTestBase).super_TestBase.super_TestCase.super_TestCase.
              super_TestNode._vptr_TestNode[0xc])();
    acStack_56[lVar3] = (char)iVar1;
  }
  local_50 = 0;
LAB_0096412c:
  if ((GLuint)local_50 == 0x22) {
    return;
  }
  TVar5 = TestBase::getType((TestBase *)this_00,(GLuint)local_50);
  uVar2 = 0;
  do {
    bVar4 = true;
    if (uVar2 != 0) {
      if (uVar2 == 0x81) break;
      bVar4 = (uVar2 & uVar2 - 1) != 0;
    }
    for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
      if (acStack_56[lVar3] != '\0') {
        local_48.m_stage = (STAGES)lVar3;
        this_00 = (UniformBlockMemberAlignNonPowerOf2Test *)&this->m_test_cases;
        local_48.m_alignment = uVar2;
        local_48.m_type = TVar5;
        local_48.m_should_fail = bVar4;
        std::
        vector<gl4cts::EnhancedLayouts::UniformBlockMemberAlignNonPowerOf2Test::testCase,_std::allocator<gl4cts::EnhancedLayouts::UniformBlockMemberAlignNonPowerOf2Test::testCase>_>
        ::push_back(&this->m_test_cases,&local_48);
      }
    }
    uVar2 = uVar2 + 1;
  } while( true );
  local_50 = (ulong)((int)local_50 + 1);
  goto LAB_0096412c;
}

Assistant:

void UniformBlockMemberAlignNonPowerOf2Test::testInit()
{
	static const GLuint dmat4_size = 128;
	const GLuint		n_types	= getTypesNumber();
	bool				stage_support[Utils::Shader::STAGE_MAX];

	for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
	{
		stage_support[stage] = isStageSupported((Utils::Shader::STAGES)stage);
	}

	for (GLuint j = 0; j < n_types; ++j)
	{
		const Utils::Type& type = getType(j);

		for (GLuint align = 0; align <= dmat4_size; ++align)
		{

#if WRKARD_UNIFORMBLOCKMEMBERALIGNNONPOWEROF2TEST

			const bool should_fail = (0 == align) ? false : !isPowerOf2(align);

#else /* WRKARD_UNIFORMBLOCKMEMBERALIGNNONPOWEROF2TEST */

			const bool should_fail = !isPowerOf2(align);

#endif /* WRKARD_UNIFORMBLOCKMEMBERALIGNNONPOWEROF2TEST */

			for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
			{
				if (false == stage_support[stage])
				{
					continue;
				}

				testCase test_case = { align, type, should_fail, (Utils::Shader::STAGES)stage };

				m_test_cases.push_back(test_case);
			}
		}
	}
}